

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

pair<int,_int> mxx::min_element<int>(int *x,comm *comm)

{
  pair<int,_int> pVar1;
  anon_struct_8_2_006ded16 out;
  anon_struct_8_2_006ded16 in;
  
  in.value = *x;
  in.rank = comm->m_rank;
  MPI_Allreduce(&in,&out,1,&ompi_mpi_2int,&ompi_mpi_op_minloc,comm->mpi_comm);
  pVar1.first = out.value;
  pVar1.second = out.rank;
  return pVar1;
}

Assistant:

inline std::pair<T, int> min_element(const T& x, const mxx::comm& comm = mxx::comm()) {
    if (mxx::is_builtin_pair_type<T>::value) {
        MPI_Datatype dt = mxx::datatype_pair<T>::get_type();
        struct {
            T value;
            int rank;
        } in, out;
        in.value = x;
        in.rank = comm.rank();
        MPI_Allreduce(&in, &out, 1, dt, MPI_MINLOC, comm);
        return std::make_pair(out.value, out.rank);
    } else {
        // use custom operator
        std::pair<T, int> in = std::make_pair(x, comm.rank());
        return mxx::allreduce(in, [](const std::pair<T, int>& x, const std::pair<T, int>& y) { return x.first > y.first ? y : x;}, comm);
    }
}